

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall Fl_Text_Buffer::move_gap(Fl_Text_Buffer *this,int pos)

{
  int gapLen;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  if (this->mGapStart < pos) {
    memmove(this->mBuf + this->mGapStart,this->mBuf + this->mGapEnd,(long)(pos - this->mGapStart));
  }
  else {
    memmove(this->mBuf + (pos + (this->mGapEnd - this->mGapStart)),this->mBuf + pos,
            (long)(this->mGapStart - pos));
  }
  this->mGapEnd = (pos - this->mGapStart) + this->mGapEnd;
  this->mGapStart = (pos - this->mGapStart) + this->mGapStart;
  return;
}

Assistant:

void Fl_Text_Buffer::move_gap(int pos)
{
  int gapLen = mGapEnd - mGapStart;
  
  if (pos > mGapStart)
    memmove(&mBuf[mGapStart], &mBuf[mGapEnd], pos - mGapStart);
  else
    memmove(&mBuf[pos + gapLen], &mBuf[pos], mGapStart - pos);
  mGapEnd += pos - mGapStart;
  mGapStart += pos - mGapStart;
}